

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

int __thiscall BufferedReader::createReader(BufferedReader *this,int readBuffOffset)

{
  lock_guard<std::mutex> lVar1;
  int iVar2;
  undefined4 extraout_var;
  mapped_type *ppRVar3;
  size_t rSize;
  int local_2c;
  int newReaderID;
  lock_guard<std::mutex> lock;
  ReaderData *data;
  int readBuffOffset_local;
  BufferedReader *this_local;
  
  iVar2 = (*(this->super_AbstractReader)._vptr_AbstractReader[0xe])();
  lock._M_device = (mutex_type *)CONCAT44(extraout_var,iVar2);
  lock._M_device[1].super___mutex_base._M_mutex.__data.__owner =
       (this->super_AbstractReader).m_blockSize;
  lock._M_device[1].super___mutex_base._M_mutex.__data.__nusers =
       (this->super_AbstractReader).m_allocSize;
  lock._M_device[2].super___mutex_base._M_mutex.__data.__owner = readBuffOffset;
  ((lock._M_device)->super___mutex_base)._M_mutex.__size[0x11] = '\x01';
  ((lock._M_device)->super___mutex_base)._M_mutex.__size[0x12] = '\0';
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd8,&this->m_readersMtx);
  local_2c = createNewReaderID();
  lVar1 = lock;
  ppRVar3 = std::
            map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
            ::operator[](&this->m_readers,&local_2c);
  *ppRVar3 = (mapped_type)lVar1._M_device;
  std::map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  ::size(&this->m_readers);
  if ((this->m_started & 1U) == 0) {
    TerminatableThread::run(&this->super_TerminatableThread);
    this->m_started = true;
  }
  iVar2 = local_2c;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd8);
  return iVar2;
}

Assistant:

int BufferedReader::createReader(const int readBuffOffset)
{
    ReaderData* data = intCreateReader();

    data->m_blockSize = m_blockSize;
    data->m_allocSize = m_allocSize;

    data->m_readOffset = readBuffOffset;

    data->m_firstBlock = true;
    data->m_lastBlock = false;

    std::lock_guard lock(m_readersMtx);
    const int newReaderID = createNewReaderID();
    m_readers[newReaderID] = data;
    size_t rSize = m_readers.size();
    if (!m_started)
    {
        run(this);
        m_started = true;
    }
    LTRACE(LT_INFO, 0, "Reader #" << m_id << ". Start new stream " << newReaderID << ". stream(s): " << rSize);

    return newReaderID;
}